

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall Js::ScriptFunction::PrepareForConversionToNonPathType(ScriptFunction *this)

{
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  ScriptFunctionType *pSVar2;
  FunctionProxy *this_00;
  FunctionTypeWeakRefList *pFVar3;
  int i;
  long lVar4;
  FinalizableObject local_38;
  ProxyEntryPointInfo *entryPointInfo;
  
  local_38.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)
       (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
       super_RecyclableObject.type.ptr[1].prototype.ptr;
  this_00 = GetFunctionProxy(this);
  entryPointInfo = (ProxyEntryPointInfo *)&local_38;
  pFVar3 = FunctionProxy::GetFunctionObjectTypeList(this_00);
  if (pFVar3 != (FunctionTypeWeakRefList *)0x0) {
    for (lVar4 = 0;
        lVar4 < (pFVar3->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar4 = lVar4 + 1) {
      pRVar1 = (pFVar3->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar4].ptr;
      if ((((ulong)pRVar1 & 1) == 0 &&
           pRVar1 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
         (pSVar2 = (ScriptFunctionType *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
         pSVar2 != (ScriptFunctionType *)0x0)) {
        PrepareForConversionToNonPathType::anon_class_8_1_dd74c04a::operator()
                  ((anon_class_8_1_dd74c04a *)&entryPointInfo,pSVar2);
      }
    }
  }
  pSVar2 = (this_00->deferredPrototypeType).ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    PrepareForConversionToNonPathType::anon_class_8_1_dd74c04a::operator()
              ((anon_class_8_1_dd74c04a *)&entryPointInfo,pSVar2);
  }
  pSVar2 = (this_00->undeferredFunctionType).ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    PrepareForConversionToNonPathType::anon_class_8_1_dd74c04a::operator()
              ((anon_class_8_1_dd74c04a *)&entryPointInfo,pSVar2);
  }
  return;
}

Assistant:

void ScriptFunction::PrepareForConversionToNonPathType()
    {
        // We have a path type handler that is currently responsible for holding some number of entry point infos alive.
        // The last one will be copied on to the new dictionary type handler, but if any previous instances in the path
        // are holding different entry point infos, those need to be copied to somewhere safe.
        // The number of entry points is likely low compared to length of path, so iterate those instead.

        ProxyEntryPointInfo* entryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();

        this->GetFunctionProxy()->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            CopyEntryPointInfoToThreadContextIfNecessary(functionType->GetEntryPointInfo(), entryPointInfo);
        });
    }